

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

tuple<double,_long>
findBestCC(TKeyWaveformF *waveform0,TKeyWaveformF *waveform1,int is0,int is1,int alignWindow)

{
  undefined8 uVar1;
  _Tuple_impl<1UL,_long> _Var2;
  uint uVar3;
  undefined4 in_register_00000014;
  pointer *__ptr;
  iterator __begin1;
  pointer ptVar4;
  size_type __n;
  long lVar5;
  long lVar6;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar7;
  undefined4 extraout_XMM0_Db;
  tuple<double,_long> tVar8;
  long *local_d8;
  int nWorkers;
  int is00;
  int alignWindow_local;
  int is1_local;
  int is0_local;
  TValueCC bestcc;
  TOffset besto;
  undefined1 local_a8 [12];
  undefined4 uStack_9c;
  _Tuple_impl<1UL,_long> local_98;
  long local_90;
  thread local_88;
  vector<std::thread,_std::allocator<std::thread>_> workers;
  tuple<double,_double> ret;
  mutex mutex;
  
  local_90 = CONCAT44(in_register_00000014,is0);
  besto = -1;
  bestcc = -1.0;
  is00 = (int)((ulong)((long)(waveform1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(waveform1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                            super__Vector_impl_data._M_start) >> 3) + (alignWindow - is1) / -2;
  is1_local = alignWindow;
  is0_local = is1;
  local_98.super__Head_base<1UL,_long,_false>._M_head_impl =
       (_Head_base<1UL,_long,_false>)(_Head_base<1UL,_long,_false>)waveform0;
  calcSum((TKeyWaveformF *)&ret,(int)waveform1,is00);
  stack0xffffffffffffff60 =
       ret.super__Tuple_impl<0UL,_double,_double>.super__Head_base<0UL,_double,_false>._M_head_impl;
  local_a8._0_8_ =
       ret.super__Tuple_impl<0UL,_double,_double>.super__Tuple_impl<1UL,_double>.
       super__Head_base<1UL,_double,_false>._M_head_impl;
  uVar3 = std::thread::hardware_concurrency();
  __n = 4;
  if (uVar3 < 4) {
    __n = (size_type)uVar3;
  }
  nWorkers = (int)__n;
  mutex.super___mutex_base._M_mutex._16_8_ = 0;
  mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  mutex.super___mutex_base._M_mutex.__align = 0;
  mutex.super___mutex_base._M_mutex._8_8_ = 0;
  mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            (&workers,__n,(allocator_type *)&local_d8);
  uVar7 = local_a8._4_4_;
  uVar1 = local_a8._8_8_;
  local_a8._8_4_ = local_a8._0_4_;
  local_a8._0_8_ = uVar1;
  uStack_9c = uVar7;
  lVar5 = 0;
  lVar6 = 0;
  while( true ) {
    ptVar4 = workers.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)workers.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)workers.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 3) <= lVar6) break;
    local_88._M_id._M_thread = (id)0;
    local_d8 = (long *)operator_new(0x70);
    *local_d8 = (long)&PTR___State_00120cf0;
    *(undefined4 *)(local_d8 + 1) = local_a8._0_4_;
    *(undefined4 *)((long)local_d8 + 0xc) = local_a8._4_4_;
    *(undefined4 *)(local_d8 + 2) = local_a8._8_4_;
    *(undefined4 *)((long)local_d8 + 0x14) = uStack_9c;
    *(int *)(local_d8 + 3) = (int)lVar6;
    local_d8[4] = (long)&alignWindow_local;
    local_d8[5] = (long)&nWorkers;
    local_d8[6] = (long)waveform1;
    local_d8[7] = local_90;
    local_d8[8] = (long)&is00;
    local_d8[9] = (long)&is0_local;
    local_d8[10] = (long)&is1_local;
    local_d8[0xb] = (long)&mutex;
    local_d8[0xc] = (long)&bestcc;
    local_d8[0xd] = (long)&besto;
    std::thread::_M_start_thread(&local_88,&local_d8,0);
    if (local_d8 != (long *)0x0) {
      (**(code **)(*local_d8 + 8))();
    }
    std::thread::operator=((thread *)((long)&(ptVar4->_M_id)._M_thread + lVar5),&local_88);
    std::thread::~thread(&local_88);
    lVar6 = lVar6 + 1;
    lVar5 = lVar5 + 8;
  }
  for (; _Var2.super__Head_base<1UL,_long,_false>._M_head_impl =
              local_98.super__Head_base<1UL,_long,_false>._M_head_impl,
      ptVar4 != workers.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_finish; ptVar4 = ptVar4 + 1) {
    std::thread::join();
  }
  *(TOffset *)local_98.super__Head_base<1UL,_long,_false>._M_head_impl = besto;
  *(TValueCC *)((long)local_98.super__Head_base<1UL,_long,_false>._M_head_impl + 8) = bestcc;
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&workers);
  tVar8.super__Tuple_impl<0UL,_double,_long>.super__Head_base<0UL,_double,_false>._M_head_impl._4_4_
       = extraout_XMM0_Db;
  tVar8.super__Tuple_impl<0UL,_double,_long>.super__Head_base<0UL,_double,_false>._M_head_impl._0_4_
       = extraout_XMM0_Da;
  tVar8.super__Tuple_impl<0UL,_double,_long>.super__Tuple_impl<1UL,_long>.
  super__Head_base<1UL,_long,_false>._M_head_impl =
       _Var2.super__Head_base<1UL,_long,_false>._M_head_impl;
  return (tuple<double,_long>)tVar8.super__Tuple_impl<0UL,_double,_long>;
}

Assistant:

std::tuple<TValueCC, TOffset> findBestCC(
    const TKeyWaveformF & waveform0,
    const TKeyWaveformF & waveform1,
    int is0, int is1,
    int alignWindow) {
    TOffset besto = -1;
    TValueCC bestcc = -1.0f;

    int is00 = waveform0.size()/2 - (is1 - is0)/2;
    auto ret = calcSum(waveform0, is00, is00 + is1 - is0);
    auto sum0  = std::get<0>(ret);
    auto sum02 = std::get<1>(ret);

#ifdef __EMSCRIPTEN__
    int nWorkers = std::min(4, std::max(1, int(std::thread::hardware_concurrency()) - 2));
#else
    int nWorkers = std::min(4u, std::thread::hardware_concurrency());
    std::mutex mutex;
    std::vector<std::thread> workers(nWorkers);
    for (int i = 0; i < (int) workers.size(); ++i) {
        auto & worker = workers[i];
        worker = std::thread([&, sum0 = sum0, sum02 = sum02, i]() {
            TOffset cbesto = -1;
            TValueCC cbestcc = -1.0f;

            for (int o = -alignWindow + i; o <= alignWindow; o += nWorkers) {
                auto cc = calcCC(waveform0, waveform1, sum0, sum02, is00, is0 + o, is1 + o);
                if (cc > cbestcc) {
                    cbesto = o;
                    cbestcc = cc;
                }
            }

            {
                std::lock_guard<std::mutex> lock(mutex);
                if (cbestcc > bestcc) {
                    bestcc = cbestcc;
                    besto = cbesto;
                }
            }
        });
    }
    for (auto & worker : workers) worker.join();
#endif

    return std::tuple<TValueCC, TOffset>(bestcc, besto);
}